

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O2

void __thiscall
math::wide_integer::uintwide_t<48U,_unsigned_short,_void,_false>::eval_divide_knuth
          (uintwide_t<48U,_unsigned_short,_void,_false> *this,
          uintwide_t<24U,_unsigned_char,_void,_false> *other,
          uintwide_t<24U,_unsigned_char,_void,_false> *remainder)

{
  value_type_conflict4 *pvVar1;
  int_fast8_t iVar2;
  enable_if_t<(_false),_uintwide_t<48U,_unsigned_short>_> eVar3;
  unsigned_fast_type uVar4;
  undefined5 extraout_var;
  long lVar5;
  unsigned_fast_type u_offset;
  undefined4 local_2e;
  undefined2 local_2a;
  
  uVar4 = 0;
  for (lVar5 = 6;
      (u_offset = 3, lVar5 != 0 && (u_offset = uVar4, *(short *)(this + lVar5 + -2) == 0));
      lVar5 = lVar5 + -2) {
    uVar4 = uVar4 + 1;
  }
  lVar5 = 6;
  uVar4 = 0;
  do {
    if (lVar5 == 0) {
LAB_001414a4:
      eVar3 = limits_helper_max<false>();
      *(int *)this = (int)CONCAT53(extraout_var,eVar3.values.super_array<unsigned_char,_3UL>.elems);
      *(short *)(this + 4) = (short)((uint5)extraout_var >> 8);
      if (remainder != (uintwide_t<24U,_unsigned_char,_void,_false> *)0x0) {
        for (lVar5 = 0; lVar5 != 6; lVar5 = lVar5 + 2) {
          pvVar1 = (remainder->values).super_array<unsigned_char,_3UL>.elems + lVar5;
          pvVar1[0] = '\0';
          pvVar1[1] = '\0';
        }
      }
      return;
    }
    if (*(short *)((other->values).super_array<unsigned_char,_3UL>.elems + lVar5 + -2) != 0) {
      if (lVar5 != 0) {
        if (u_offset != 3) {
          iVar2 = compare<false,_nullptr>((uintwide_t<24U,_unsigned_char,_void,_false> *)this,other)
          ;
          if (iVar2 != '\0') {
            if (iVar2 == -1) {
              if (remainder != (uintwide_t<24U,_unsigned_char,_void,_false> *)0x0) {
                *(undefined2 *)(remainder[1].values.super_array<unsigned_char,_3UL>.elems + 1) =
                     *(undefined2 *)(this + 4);
                *(undefined4 *)remainder = *(undefined4 *)this;
              }
              uintwide_t<48u,unsigned_short,void,false>::uintwide_t<unsigned_char>(unsigned_char,std
              ::enable_if<(std::is_integral<unsigned_char>::value&&std::is_unsigned<unsigned_char>::
              value)&&(std::numeric_limits<unsigned_char>::digits<=std::
              numeric_limits<unsigned_short>::digits),void>::type__
                        (&local_2e,'\0',
                         (enable_if_t<(std::is_integral<unsigned_char>::value_&&_std::is_unsigned<unsigned_char>::value_&&_(std::numeric_limits<unsigned_char>::digits_<__std::numeric_limits<limb_type>::digits))>
                          *)0x0);
              *(undefined2 *)(this + 4) = local_2a;
              *(undefined4 *)this = local_2e;
              return;
            }
            void_math::wide_integer::uintwide_t<48u,unsigned_short,void,false>::
            eval_divide_knuth_core<48u>(unsigned_long,unsigned_long,math::wide_integer::
            uintwide_t<48u,unsigned_short,void,false>const&,math::wide_integer::
            uintwide_t<48u,unsigned_short,void,false>*,std::
            enable_if<((48u)>(static_cast<unsigned_int>(std::numeric_limits<unsigned_short>::
            digits))),int>::type__
                      (this,u_offset,uVar4,other,remainder,
                       (enable_if_t<(48U_>_static_cast<size_t>_std__numeric_limits<limb_type>__digits____int>
                        *)0x0);
            return;
          }
          uintwide_t<48u,unsigned_short,void,false>::uintwide_t<unsigned_char>(unsigned_char,std::
          enable_if<(std::is_integral<unsigned_char>::value&&std::is_unsigned<unsigned_char>::
          value)&&(std::numeric_limits<unsigned_char>::digits<=std::numeric_limits<unsigned_short>::
          digits),void>::type__
                    (&local_2e,'\x01',
                     (enable_if_t<(std::is_integral<unsigned_char>::value_&&_std::is_unsigned<unsigned_char>::value_&&_(std::numeric_limits<unsigned_char>::digits_<__std::numeric_limits<limb_type>::digits))>
                      *)0x0);
          *(undefined2 *)(this + 4) = local_2a;
          *(undefined4 *)this = local_2e;
        }
        if (remainder == (uintwide_t<24U,_unsigned_char,_void,_false> *)0x0) {
          return;
        }
        uintwide_t<48u,unsigned_short,void,false>::uintwide_t<unsigned_char>(unsigned_char,std::
        enable_if<(std::is_integral<unsigned_char>::value&&std::is_unsigned<unsigned_char>::
        value)&&(std::numeric_limits<unsigned_char>::digits<=std::numeric_limits<unsigned_short>::
        digits),void>::type__
                  (&local_2e,'\0',
                   (enable_if_t<(std::is_integral<unsigned_char>::value_&&_std::is_unsigned<unsigned_char>::value_&&_(std::numeric_limits<unsigned_char>::digits_<__std::numeric_limits<limb_type>::digits))>
                    *)0x0);
        *(undefined2 *)(remainder[1].values.super_array<unsigned_char,_3UL>.elems + 1) = local_2a;
        *(undefined4 *)remainder = local_2e;
        return;
      }
      goto LAB_001414a4;
    }
    uVar4 = uVar4 + 1;
    lVar5 = lVar5 + -2;
  } while( true );
}

Assistant:

constexpr auto eval_divide_knuth(const uintwide_t& other, uintwide_t* remainder = nullptr) -> void
    {
      // Use Knuth's long division algorithm.
      // The loop-ordering of indices in Knuth's original
      // algorithm has been reversed due to the data format
      // used here. Several optimizations and combinations
      // of logic have been carried out in the source code.

      // See also:
      // D.E. Knuth, "The Art of Computer Programming, Volume 2:
      // Seminumerical Algorithms", Addison-Wesley (1998),
      // Section 4.3.1 Algorithm D and Exercise 16.

      using local_uint_index_type = unsigned_fast_type;

      local_uint_index_type u_offset { };
      local_uint_index_type v_offset { };

      auto crit_u =       values.crbegin();
      auto crit_v = other.values.crbegin();

      while(crit_u != values.crend() && (*crit_u == static_cast<limb_type>(UINT8_C(0)))) // NOLINT(altera-id-dependent-backward-branch)
      {
        ++crit_u;
        ++u_offset;
      }

      while(crit_v != other.values.crend() && (*crit_v == static_cast<limb_type>(UINT8_C(0)))) // NOLINT(altera-id-dependent-backward-branch)
      {
        ++crit_v;
        ++v_offset;
      }

      if(v_offset == static_cast<local_uint_index_type>(number_of_limbs))
      {
        // The denominator is zero. Set the maximum value and return.
        // This also catches (0 / 0) and sets the maximum value for it.
        static_cast<void>(operator=(limits_helper_max<IsSigned>())); // LCOV_EXCL_LINE

        if(remainder != nullptr) // LCOV_EXCL_LINE
        {
          detail::fill_unsafe(remainder->values.begin(), remainder->values.end(), static_cast<limb_type>(UINT8_C(0))); // LCOV_EXCL_LINE
        }
      }
      else if(u_offset == static_cast<local_uint_index_type>(number_of_limbs))
      {
        // The numerator is zero. Do nothing and return.

        if(remainder != nullptr)
        {
          *remainder = uintwide_t(static_cast<std::uint8_t>(UINT8_C(0)));
        }
      }
      else
      {
        const auto result_of_compare_left_with_right = compare(other);

        const auto left_is_less_than_right = (result_of_compare_left_with_right == INT8_C(-1));
        const auto left_is_equal_to_right  = (result_of_compare_left_with_right == INT8_C( 0));

        if(left_is_less_than_right)
        {
          // If the denominator is larger than the numerator,
          // then the result of the division is zero.
          if(remainder != nullptr)
          {
            *remainder = *this;
          }

          operator=(static_cast<std::uint8_t>(UINT8_C(0)));
        }
        else if(left_is_equal_to_right)
        {
          // If the denominator is equal to the numerator,
          // then the result of the division is one.
          operator=(static_cast<std::uint8_t>(UINT8_C(1)));

          if(remainder != nullptr)
          {
            *remainder = uintwide_t(static_cast<std::uint8_t>(UINT8_C(0)));
          }
        }
        else
        {
          eval_divide_knuth_core(u_offset, v_offset, other, remainder);
        }
      }
    }